

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *this,size_t dist,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2)

{
  block_decomposition_buffered<unsigned_long> *this_00;
  size_type __new_size;
  ulong uVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  size_t i;
  datatype mxxindex_t;
  MPI_Request recv_reqs [2];
  
  __new_size = this->local_size;
  if (__new_size !=
      (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                 );
  }
  uVar1 = (this->part).prefix;
  puVar2 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar7 - (long)puVar2 >> 3 != __new_size) {
    if (puVar7 != puVar2) {
      (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    mxxindex_t._vptr_datatype = (_func_int **)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (param_2,__new_size,(value_type_conflict1 *)&mxxindex_t);
  }
  this_00 = &this->part;
  mxxindex_t._vptr_datatype = (_func_int **)&PTR__datatype_001b4f50;
  mxxindex_t.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mxxindex_t.builtin = true;
  uVar8 = uVar1 + dist;
  uVar9 = 0;
  if (uVar8 < this->n) {
    iVar3 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                      (this_00,uVar8);
    uVar5 = (ulong)(iVar3 + 1);
    uVar9 = (this->part).mod;
    uVar10 = uVar5;
    if (uVar9 < uVar5) {
      uVar10 = uVar9;
    }
    uVar10 = ((this->part).div * uVar5 - uVar8) + uVar10;
    uVar9 = 0;
    if (iVar3 != (this->comm).m_rank) {
      if (0x7ffffffe < uVar10) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start,uVar10 & 0xffffffff,&ompi_mpi_unsigned_long,iVar3,
                2,(this->comm).mpi_comm,recv_reqs);
      uVar9 = 1;
    }
    uVar8 = this->local_size - uVar10;
    if ((uVar10 <= this->local_size && uVar8 != 0) && (iVar3 != this->p + -1)) {
      if (0x7ffffffe < uVar8) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start + uVar10,uVar8,&ompi_mpi_unsigned_long,iVar3 + 1,2
                ,(this->comm).mpi_comm,recv_reqs + uVar9);
      uVar9 = (ulong)((int)uVar9 + 1);
    }
  }
  sVar6 = this->local_size;
  if (dist <= (uVar1 + sVar6) - 1) {
    sVar11 = dist - uVar1;
    if (dist < uVar1 || sVar11 == 0) {
      iVar3 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                        (this_00,uVar1 - dist);
      sVar6 = this->local_size;
    }
    else {
      iVar3 = -1;
    }
    iVar4 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                      (this_00,~dist + uVar1 + sVar6);
    if (iVar3 == iVar4) {
      sVar11 = 0;
    }
    else if (-1 < iVar3) {
      if (iVar3 == (this->comm).m_rank) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      uVar8 = (this->part).mod;
      uVar10 = (ulong)(iVar3 + 1);
      if (uVar10 <= uVar8) {
        uVar8 = uVar10;
      }
      sVar11 = (dist - uVar1) + uVar8 + uVar10 * (this->part).div;
      MPI_Send((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,sVar11 & 0xffffffff,&ompi_mpi_unsigned_long,
               iVar3,2,(this->comm).mpi_comm);
    }
    if (iVar4 == (this->comm).m_rank) {
      if (sVar11 != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      puVar2 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar7 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (; dist < this->local_size; dist = dist + 1) {
        *puVar7 = puVar2[dist];
        puVar7 = puVar7 + 1;
      }
    }
    else {
      MPI_Send((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar11,(int)this->local_size - (int)sVar11
               ,&ompi_mpi_unsigned_long,iVar4,2,(this->comm).mpi_comm);
    }
  }
  MPI_Waitall(uVar9,recv_reqs,0);
  mxx::datatype::~datatype(&mxxindex_t);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}